

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDInt8x16Operation::OpShiftRightByScalar(SIMDValue *value,int count)

{
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2 = psllw((undefined1  [16])value->field_0,8);
  auVar3 = psraw(auVar2,ZEXT416((count & 7U) + 8));
  auVar2 = psraw((undefined1  [16])value->field_0,ZEXT416(count & 7U));
  aVar1 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)pblendvb(auVar2,auVar3,_DAT_0111d5f0);
  return (SIMDValue)aVar1;
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpShiftRightByScalar(const SIMDValue& value, int count)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(value);
        X86SIMDValue x86tmp1;

        count = count & SIMDUtils::SIMDGetShiftAmountMask(1);

        x86tmp1.m128i_value = _mm_slli_epi16(tmpaValue.m128i_value, 8);
        x86tmp1.m128i_value = _mm_srai_epi16(x86tmp1.m128i_value, count + 8);

        x86tmp1.m128i_value = _mm_and_si128(x86tmp1.m128i_value, X86_LOWBYTES_MASK.m128i_value);

        tmpaValue.m128i_value = _mm_srai_epi16(tmpaValue.m128i_value, count);
        tmpaValue.m128i_value = _mm_and_si128(tmpaValue.m128i_value, X86_HIGHBYTES_MASK.m128i_value);

        x86Result.m128i_value = _mm_or_si128(tmpaValue.m128i_value, x86tmp1.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }